

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDynamicRowMatrix.cpp
# Opt level: O1

void __thiscall HighsDynamicRowMatrix::unlinkColumns(HighsDynamicRowMatrix *this,HighsInt rowindex)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer puVar4;
  pointer ppVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer piVar10;
  pointer piVar11;
  pointer pdVar12;
  pointer piVar13;
  int iVar14;
  pointer piVar15;
  int iVar16;
  long lVar17;
  
  puVar4 = (this->colsLinked).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4[rowindex] != '\0') {
    puVar4[rowindex] = '\0';
    ppVar5 = (this->ARrange_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = ppVar5[rowindex].first;
    iVar2 = ppVar5[rowindex].second;
    if (iVar2 != iVar1) {
      piVar6 = (this->AprevNeg_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->AnextNeg_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->AheadNeg_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar9 = (this->AnextPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = (this->ARindex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar11 = (this->AprevPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar12 = (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar13 = (this->AheadPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar17 = 0;
      do {
        iVar3 = piVar10[iVar1 + lVar17];
        if (pdVar12[iVar1 + lVar17] <= 0.0) {
          iVar16 = piVar6[iVar1 + lVar17];
          iVar14 = piVar7[iVar1 + lVar17];
          if ((long)iVar14 != -1) {
            piVar6[iVar14] = iVar16;
          }
          piVar15 = piVar7;
          if (iVar16 == -1) {
            piVar15 = piVar8;
            iVar16 = iVar3;
          }
        }
        else {
          iVar16 = piVar11[iVar1 + lVar17];
          iVar14 = piVar9[iVar1 + lVar17];
          if ((long)iVar14 != -1) {
            piVar11[iVar14] = iVar16;
          }
          piVar15 = piVar9;
          if (iVar16 == -1) {
            piVar15 = piVar13;
            iVar16 = iVar3;
          }
        }
        piVar15[iVar16] = iVar14;
        lVar17 = lVar17 + 1;
      } while (iVar2 - iVar1 != (int)lVar17);
    }
  }
  return;
}

Assistant:

void HighsDynamicRowMatrix::unlinkColumns(HighsInt rowindex) {
  if (!colsLinked[rowindex]) return;

  colsLinked[rowindex] = false;
  HighsInt start = ARrange_[rowindex].first;
  HighsInt end = ARrange_[rowindex].second;
  for (HighsInt i = start; i != end; ++i) {
    HighsInt col = ARindex_[i];

    if (ARvalue_[i] > 0) {
      HighsInt prev = AprevPos_[i];
      HighsInt next = AnextPos_[i];

      if (next != -1) {
        assert(AprevPos_[next] == i);
        AprevPos_[next] = prev;
      }

      if (prev != -1) {
        assert(AnextPos_[prev] == i);
        AnextPos_[prev] = next;
      } else {
        assert(AheadPos_[col] == i);
        AheadPos_[col] = next;
      }
    } else {
      HighsInt prev = AprevNeg_[i];
      HighsInt next = AnextNeg_[i];

      if (next != -1) {
        assert(AprevNeg_[next] == i);
        AprevNeg_[next] = prev;
      }

      if (prev != -1) {
        assert(AnextNeg_[prev] == i);
        AnextNeg_[prev] = next;
      } else {
        assert(AheadNeg_[col] == i);
        AheadNeg_[col] = next;
      }
    }
  }
}